

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::AddExtensionGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  bool bVar1;
  FieldDescriptor *extension_field;
  ExtensionGenerator *this_00;
  int index;
  Descriptor *this_01;
  string_view root_or_message_class_name;
  _Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false> local_48;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
  *local_40;
  GenerationOptions *local_38;
  
  this_01 = this->descriptor_;
  if (0 < *(int *)(this_01 + 0x8c)) {
    local_40 = (vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
                *)&this->extension_generators_;
    index = 0;
    do {
      extension_field = Descriptor::extension(this_01,index);
      if (this->generation_options_->strip_custom_options == true) {
        bVar1 = ExtensionIsCustomOption(extension_field);
        if (!bVar1) goto LAB_002dda8c;
      }
      else {
LAB_002dda8c:
        local_38 = this->generation_options_;
        this_00 = (ExtensionGenerator *)operator_new(0x50);
        root_or_message_class_name._M_str = (this->class_name_)._M_dataplus._M_p;
        root_or_message_class_name._M_len = (this->class_name_)._M_string_length;
        ExtensionGenerator::ExtensionGenerator
                  (this_00,root_or_message_class_name,extension_field,local_38);
        local_48._M_head_impl = this_00;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
        ::
        emplace_back<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>
                  ((vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
                    *)extension_generators,
                   (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                    *)&local_48);
        std::
        unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                       *)&local_48);
        local_48._M_head_impl =
             (extension_generators->
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
             ._M_head_impl;
        std::
        vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
        ::emplace_back<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>
                  (local_40,&local_48._M_head_impl);
      }
      index = index + 1;
      this_01 = this->descriptor_;
    } while (index < *(int *)(this_01 + 0x8c));
  }
  return;
}

Assistant:

void MessageGenerator::AddExtensionGenerators(
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    const FieldDescriptor* extension = descriptor_->extension(i);
    if (!generation_options_.strip_custom_options ||
        !ExtensionIsCustomOption(extension)) {
      extension_generators->push_back(std::make_unique<ExtensionGenerator>(
          class_name_, extension, generation_options_));
      extension_generators_.push_back(extension_generators->back().get());
    }
  }
}